

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

uint32 rw::ps2::getBatchSize(MatPipeline *pipe,uint32 vertCount)

{
  uint uVar1;
  uint32 uVar2;
  long lVar3;
  
  if (vertCount != 0) {
    uVar2 = 1;
    lVar3 = 4;
    do {
      if ((pipe->attribs[lVar3 + -4] != (PipeAttribute *)0x0) &&
         (uVar1 = pipe->attribs[lVar3 + -4]->attrib, (uVar1 & 6) == 0)) {
        uVar2 = uVar2 + ((((uVar1 >> 0x1a & 3) + 1) *
                          *(int *)(attribSize(unsigned_int)::size + (uVar1 >> 0x16 & 0xc)) >> 3) *
                         vertCount + 0xf >> 4) + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xe);
    return uVar2;
  }
  return 0;
}

Assistant:

static uint32
getBatchSize(MatPipeline *pipe, uint32 vertCount)
{
	PipeAttribute *a;
	if(vertCount == 0)
		return 0;
	uint32 size = 1;	// ITOP &c. at the end
	for(uint i = 0; i < nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i]) && (a->attrib & AT_RW) == 0){
			size++;	// UNPACK &c.
			size += QWC(vertCount*attribSize(a->attrib));
		}
	return size;
}